

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFSwabFloat(float *fp)

{
  ushort *puVar1;
  undefined1 uVar2;
  
  uVar2 = *(undefined1 *)((long)fp + 3);
  *(undefined1 *)((long)fp + 3) = *(undefined1 *)fp;
  *(undefined1 *)fp = uVar2;
  puVar1 = (ushort *)((long)fp + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void TIFFSwabFloat(float *fp)
{
    register unsigned char *cp = (unsigned char *)fp;
    unsigned char t;
    assert(sizeof(float) == 4);
    t = cp[3];
    cp[3] = cp[0];
    cp[0] = t;
    t = cp[2];
    cp[2] = cp[1];
    cp[1] = t;
}